

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPipelineDiscardRectangleStateCreateInfoEXT *create_info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value,
               DynamicStateInfo *dynamic_state_info)

{
  GenericStringRef<char> local_f0;
  GenericStringRef<char> local_e0;
  GenericStringRef<char> local_d0;
  GenericStringRef<char> local_c0;
  GenericStringRef<char> local_b0;
  undefined1 local_a0 [8];
  Value discardRectangle;
  undefined1 local_88 [4];
  uint32_t i;
  Value discardRectangles;
  GenericStringRef<char> local_68;
  GenericStringRef<char> local_58;
  GenericStringRef<char> local_48;
  undefined1 local_38 [8];
  Value value;
  DynamicStateInfo *dynamic_state_info_local;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkPipelineDiscardRectangleStateCreateInfoEXT *create_info_local;
  
  value.data_.o.members = (Member *)dynamic_state_info;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_38,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_48,(char (*) [6])"sType");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkStructureType>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_48,create_info->sType,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_58,(char (*) [6])"flags");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_58,create_info->flags,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<21u>
            (&local_68,(char (*) [21])"discardRectangleMode");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkDiscardRectangleModeEXT>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_68,create_info->discardRectangleMode,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<22u>
            ((GenericStringRef<char> *)((long)&discardRectangles.data_ + 8),
             (char (*) [22])"discardRectangleCount");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,(StringRefType *)((long)&discardRectangles.data_ + 8),
             create_info->discardRectangleCount,alloc);
  if ((value.data_.s.str != (Ch *)0x0) &&
     ((((value.data_.o.members)->value).data_.ss.str[0xb] & 1U) == 0)) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_88,kArrayType);
    for (discardRectangle.data_._12_4_ = 0;
        (uint)discardRectangle.data_._12_4_ < create_info->discardRectangleCount;
        discardRectangle.data_._12_4_ = discardRectangle.data_._12_4_ + 1) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_a0,kObjectType);
      rapidjson::GenericStringRef<char>::GenericStringRef<2u>(&local_b0,(char (*) [2])0x1ce489);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)local_a0,&local_b0,
                       create_info->pDiscardRectangles[(uint)discardRectangle.data_._12_4_].offset.x
                       ,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<2u>(&local_c0,(char (*) [2])0x1c7c45);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)local_a0,&local_c0,
                       create_info->pDiscardRectangles[(uint)discardRectangle.data_._12_4_].offset.y
                       ,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_d0,(char (*) [6])"width");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_a0,&local_d0,
                 create_info->pDiscardRectangles[(uint)discardRectangle.data_._12_4_].extent.width,
                 alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_e0,(char (*) [7])"height");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_a0,&local_e0,
                 create_info->pDiscardRectangles[(uint)discardRectangle.data_._12_4_].extent.height,
                 alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_88,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_a0,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_a0);
    }
    rapidjson::GenericStringRef<char>::GenericStringRef<18u>
              (&local_f0,(char (*) [18])"discardRectangles");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_38,&local_f0,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_88,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_88);
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  operator=(out_value,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_38);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_38);
  return true;
}

Assistant:

static bool json_value(const VkPipelineDiscardRectangleStateCreateInfoEXT &create_info, Allocator &alloc, Value *out_value,
                       const DynamicStateInfo *dynamic_state_info)
{
	Value value(kObjectType);
	value.AddMember("sType", create_info.sType, alloc);
	value.AddMember("flags", create_info.flags, alloc);
	value.AddMember("discardRectangleMode", create_info.discardRectangleMode, alloc);
	value.AddMember("discardRectangleCount", create_info.discardRectangleCount, alloc);

	if (dynamic_state_info && !dynamic_state_info->discard_rectangle)
	{
		Value discardRectangles(kArrayType);
		for (uint32_t i = 0; i < create_info.discardRectangleCount; i++)
		{
			Value discardRectangle(kObjectType);
			discardRectangle.AddMember("x", create_info.pDiscardRectangles[i].offset.x, alloc);
			discardRectangle.AddMember("y", create_info.pDiscardRectangles[i].offset.y, alloc);
			discardRectangle.AddMember("width", create_info.pDiscardRectangles[i].extent.width, alloc);
			discardRectangle.AddMember("height", create_info.pDiscardRectangles[i].extent.height, alloc);
			discardRectangles.PushBack(discardRectangle, alloc);
		}
		value.AddMember("discardRectangles", discardRectangles, alloc);
	}

	*out_value = value;
	return true;
}